

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O1

bool __thiscall
unixsocketipc::MessageReceiver::receive_buffer
          (MessageReceiver *this,int client_socket_fd,char *buf,uint32_t size)

{
  uint uVar1;
  ssize_t sVar2;
  bool bVar3;
  
  bVar3 = size == 0;
  if (!bVar3) {
    while( true ) {
      sVar2 = recv(client_socket_fd,buf,(ulong)size,0);
      uVar1 = (uint)sVar2;
      if ((int)uVar1 < 1) break;
      size = size - uVar1;
      bVar3 = size == 0;
      if (bVar3) {
        return bVar3;
      }
      buf = buf + (uVar1 & 0x7fffffff);
    }
  }
  return bVar3;
}

Assistant:

bool MessageReceiver::receive_buffer(int client_socket_fd, char* buf, uint32_t size) {
   auto num_bytes_left = size;
   int num_bytes_received;
   while ((num_bytes_left > 0) && ((num_bytes_received = recv(client_socket_fd, buf, num_bytes_left, 0)) > 0)) {
      num_bytes_left -= num_bytes_received;
      buf += num_bytes_received;
      DEBUG_MSG("%s: received %d bytes\n", __FUNCTION__, num_bytes_received);
   }

   return (num_bytes_left == 0);
}